

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::FileDescriptorTables::AddFieldByNumber
          (FileDescriptorTables *this,FieldDescriptor *field)

{
  __node_base *p_Var1;
  size_type *psVar2;
  _Hash_node_base *p_Var3;
  __buckets_ptr pp_Var4;
  __node_ptr p_Var5;
  _Hash_node_base *p_Var6;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var7;
  ulong uVar8;
  size_type __n;
  ulong uVar9;
  _Hash_node_base _Var10;
  _Hash_node_base *p_Var11;
  pointer __ptr_1;
  undefined1 auVar12 [16];
  __buckets_alloc_type __alloc;
  new_allocator<std::__detail::_Hash_node_base_*> local_59;
  size_t local_58;
  FieldsByNumberMap *local_50;
  key_type local_48;
  FieldDescriptor *local_38;
  
  local_48.first = *(Descriptor **)(field + 0x50);
  local_48.second = *(int *)(field + 0x44);
  p_Var11 = (_Hash_node_base *)
            ((long)local_48.second * 0x1000193 ^ (long)local_48.first * 0x100011b);
  uVar8 = (ulong)p_Var11 % (this->fields_by_number_)._M_h._M_bucket_count;
  local_38 = field;
  p_Var5 = std::
           _Hashtable<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&(this->fields_by_number_)._M_h,uVar8,&local_48,(__hash_code)p_Var11);
  if (p_Var5 == (__node_ptr)0x0) {
    local_50 = &this->fields_by_number_;
    p_Var6 = (_Hash_node_base *)operator_new(0x28);
    p_Var6->_M_nxt = (_Hash_node_base *)0x0;
    p_Var6[1]._M_nxt = (_Hash_node_base *)local_48.first;
    p_Var6[2]._M_nxt = (_Hash_node_base *)CONCAT44(local_48._12_4_,local_48.second);
    p_Var6[3]._M_nxt = (_Hash_node_base *)local_38;
    local_58 = (this->fields_by_number_)._M_h._M_rehash_policy._M_next_resize;
    auVar12 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(this->fields_by_number_)._M_h._M_rehash_policy,
                         (this->fields_by_number_)._M_h._M_bucket_count,
                         (this->fields_by_number_)._M_h._M_element_count);
    __n = auVar12._8_8_;
    if ((auVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if (__n == 1) {
        __s = &(this->fields_by_number_)._M_h._M_single_bucket;
        (this->fields_by_number_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                        (&local_59,__n,(void *)0x0);
        memset(__s,0,__n * 8);
      }
      _Var10._M_nxt = (this->fields_by_number_)._M_h._M_before_begin._M_nxt;
      (this->fields_by_number_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      if (_Var10._M_nxt != (_Hash_node_base *)0x0) {
        p_Var1 = &(this->fields_by_number_)._M_h._M_before_begin;
        uVar8 = 0;
        do {
          p_Var3 = (_Var10._M_nxt)->_M_nxt;
          uVar9 = (ulong)_Var10._M_nxt[4]._M_nxt % __n;
          if (__s[uVar9] == (_Hash_node_base *)0x0) {
            (_Var10._M_nxt)->_M_nxt = p_Var1->_M_nxt;
            p_Var1->_M_nxt = _Var10._M_nxt;
            __s[uVar9] = p_Var1;
            if ((_Var10._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
              pp_Var7 = __s + uVar8;
              goto LAB_002bcf8b;
            }
          }
          else {
            (_Var10._M_nxt)->_M_nxt = __s[uVar9]->_M_nxt;
            pp_Var7 = &__s[uVar9]->_M_nxt;
            uVar9 = uVar8;
LAB_002bcf8b:
            *pp_Var7 = _Var10._M_nxt;
          }
          _Var10._M_nxt = p_Var3;
          uVar8 = uVar9;
        } while (p_Var3 != (_Hash_node_base *)0x0);
      }
      pp_Var4 = (this->fields_by_number_)._M_h._M_buckets;
      if (&(this->fields_by_number_)._M_h._M_single_bucket != pp_Var4) {
        operator_delete(pp_Var4);
      }
      (this->fields_by_number_)._M_h._M_bucket_count = __n;
      (this->fields_by_number_)._M_h._M_buckets = __s;
      uVar8 = (ulong)p_Var11 % __n;
    }
    p_Var6[4]._M_nxt = p_Var11;
    pp_Var4 = (local_50->_M_h)._M_buckets;
    if (pp_Var4[uVar8] == (__node_base_ptr)0x0) {
      p_Var11 = (this->fields_by_number_)._M_h._M_before_begin._M_nxt;
      p_Var6->_M_nxt = p_Var11;
      (this->fields_by_number_)._M_h._M_before_begin._M_nxt = p_Var6;
      if (p_Var11 != (_Hash_node_base *)0x0) {
        pp_Var4[(ulong)p_Var11[4]._M_nxt % (this->fields_by_number_)._M_h._M_bucket_count] = p_Var6;
      }
      (local_50->_M_h)._M_buckets[uVar8] = &(this->fields_by_number_)._M_h._M_before_begin;
    }
    else {
      p_Var6->_M_nxt = pp_Var4[uVar8]->_M_nxt;
      pp_Var4[uVar8]->_M_nxt = p_Var6;
    }
    psVar2 = &(this->fields_by_number_)._M_h._M_element_count;
    *psVar2 = *psVar2 + 1;
  }
  return p_Var5 == (__node_ptr)0x0;
}

Assistant:

bool FileDescriptorTables::AddFieldByNumber(const FieldDescriptor* field) {
  DescriptorIntPair key(field->containing_type(), field->number());
  return InsertIfNotPresent(&fields_by_number_, key, field);
}